

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test::
ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test
          (ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test *this)

{
  ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseVisibilityTest);
  (this->super_ParseVisibilityTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test_02a11ee0;
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NonStrictLocalMessage) {
  ExpectParsesTo(
      R"schema(
        edition = "2024";
        local message B {
          export enum NestedEnum {
            B_VAL = 0;
          }
          local message NestedMessage {
          }
        }
        )schema",
      R"pb(message_type {
             name: "B"
             enum_type {
               name: "NestedEnum"
               value { name: "B_VAL" number: 0 }
               visibility: VISIBILITY_EXPORT
             }
             nested_type { name: "NestedMessage" visibility: VISIBILITY_LOCAL }
             visibility: VISIBILITY_LOCAL
           }
           syntax: "editions"
           edition: EDITION_2024
      )pb");
}